

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

void __thiscall
kj::_::
HeapDisposer<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>::
disposeImpl(HeapDisposer<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>
            *this,void *pointer)

{
  void *pointer_local;
  HeapDisposer<kj::_::ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>_>
  *this_local;
  
  if (pointer != (void *)0x0) {
    ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_>::
    ~ImmediatePromiseNode
              ((ImmediatePromiseNode<kj::Array<kj::(anonymous_namespace)::SocketAddress>_> *)pointer
              );
    operator_delete(pointer,0x188);
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }